

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::load_flattened_struct
          (string *__return_storage_ptr__,CompilerGLSL *this,string *basename,SPIRType *type)

{
  string *psVar1;
  SPIRType *type_00;
  _Alloc_hider _Var2;
  ulong uVar3;
  string local_78;
  string *local_58;
  string local_50;
  
  local_58 = basename;
  type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,type);
  ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
           buffer_size != 0) {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      type_00 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [uVar3].id);
      if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
        to_flattened_struct_member(&local_50,this,local_58,type,(uint32_t)uVar3);
        load_flattened_struct(&local_78,this,&local_50,type_00);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        psVar1 = &local_50;
        _Var2._M_p = local_50._M_dataplus._M_p;
      }
      else {
        to_flattened_struct_member(&local_78,this,local_58,type,(uint32_t)uVar3);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
        psVar1 = &local_78;
        _Var2._M_p = local_78._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &psVar1->field_2) {
        operator_delete(_Var2._M_p);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (uint)(type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size);
  }
  ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::load_flattened_struct(const string &basename, const SPIRType &type)
{
	auto expr = type_to_glsl_constructor(type);
	expr += '(';

	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		if (i)
			expr += ", ";

		auto &member_type = get<SPIRType>(type.member_types[i]);
		if (member_type.basetype == SPIRType::Struct)
			expr += load_flattened_struct(to_flattened_struct_member(basename, type, i), member_type);
		else
			expr += to_flattened_struct_member(basename, type, i);
	}
	expr += ')';
	return expr;
}